

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O2

void Assimp::SplitLargeMeshesProcess_Triangle::UpdateNode
               (aiNode *pcNode,
               vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               *avList)

{
  pointer ppVar1;
  uint b;
  uint *puVar2;
  uint i;
  ulong uVar3;
  uint i_1;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aiEntries;
  uint local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
             (ulong)(pcNode->mNumMeshes + 1));
  for (uVar3 = 0; uVar3 < pcNode->mNumMeshes; uVar3 = uVar3 + 1) {
    local_4c = 0;
    while( true ) {
      ppVar1 = (avList->
               super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(avList->
                        super__Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <=
          (ulong)local_4c) break;
      if (ppVar1[local_4c].second == pcNode->mMeshes[uVar3]) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
      }
      local_4c = local_4c + 1;
    }
  }
  if (pcNode->mMeshes != (uint *)0x0) {
    operator_delete__(pcNode->mMeshes);
  }
  uVar4 = (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48._M_impl.super__Vector_impl_data._M_start) >> 2;
  pcNode->mNumMeshes = (uint)uVar4;
  puVar2 = (uint *)operator_new__((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_48._M_impl.super__Vector_impl_data._M_start &
                                  0x3fffffffc);
  pcNode->mMeshes = puVar2;
  for (uVar3 = 0; uVar3 < (uVar4 & 0xffffffff); uVar3 = uVar3 + 1) {
    pcNode->mMeshes[uVar3] = local_48._M_impl.super__Vector_impl_data._M_start[uVar3];
    uVar4 = (ulong)pcNode->mNumMeshes;
  }
  for (uVar3 = 0; uVar3 < pcNode->mNumChildren; uVar3 = uVar3 + 1) {
    UpdateNode(pcNode->mChildren[uVar3],avList);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::UpdateNode(aiNode* pcNode,
        const std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    // for every index in out list build a new entry
    std::vector<unsigned int> aiEntries;
    aiEntries.reserve(pcNode->mNumMeshes + 1);
    for (unsigned int i = 0; i < pcNode->mNumMeshes;++i) {
        for (unsigned int a = 0; a < avList.size();++a) {
            if (avList[a].second == pcNode->mMeshes[i]) {
                aiEntries.push_back(a);
            }
        }
    }

    // now build the new list
    delete[] pcNode->mMeshes;
    pcNode->mNumMeshes = (unsigned int)aiEntries.size();
    pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];

    for (unsigned int b = 0; b < pcNode->mNumMeshes;++b) {
        pcNode->mMeshes[b] = aiEntries[b];
    }

    // recusively update all other nodes
    for (unsigned int i = 0; i < pcNode->mNumChildren;++i) {
        UpdateNode ( pcNode->mChildren[i], avList );
    }
}